

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>
     *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  double dVar4;
  
  vVar1 = FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>::dx
                    (&this->left_->fadexpr_,i);
  dVar4 = ((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ /
          (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  vVar2 = FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>::dx
                    (&this->right_->fadexpr_,i);
  vVar3 = FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>::val
                    (&this->left_->fadexpr_);
  return vVar3 * vVar2 + vVar1 * dVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}